

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_tsetm(jit_State *J,BCReg ra,BCReg rn,int32_t i)

{
  TValue *pTVar1;
  TRef local_128;
  TRef local_124;
  GCtab *t;
  cTValue *basev;
  RecordIndex ix;
  int32_t i_local;
  BCReg rn_local;
  BCReg ra_local;
  jit_State *J_local;
  
  pTVar1 = J->L->base;
  basev = (cTValue *)(pTVar1[ra - 1].u64 & 0x7fffffffffff | 0xfffa000000000000);
  ix.idxchain = i;
  if (J->base[ra - 1] == 0) {
    local_124 = sload(J,ra - 1);
  }
  else {
    local_124 = J->base[ra - 1];
  }
  ix.oldv._0_4_ = local_124;
  ix.mt = 0;
  for (i_local = ra; (uint)i_local < rn; i_local = i_local + 1) {
    ix.tabv.n = (lua_Number)ix.idxchain;
    ix.oldv._4_4_ = lj_ir_kint(J,ix.idxchain);
    ix.keyv = pTVar1[(uint)i_local];
    if (J->base[(uint)i_local] == 0) {
      local_128 = sload(J,i_local);
    }
    else {
      local_128 = J->base[(uint)i_local];
    }
    ix.tab = local_128;
    lj_record_idx(J,(RecordIndex *)&basev);
    ix.idxchain = ix.idxchain + 1;
  }
  return;
}

Assistant:

static void rec_tsetm(jit_State *J, BCReg ra, BCReg rn, int32_t i)
{
  RecordIndex ix;
  cTValue *basev = J->L->base;
  GCtab *t = tabV(&basev[ra-1]);
  settabV(J->L, &ix.tabv, t);
  ix.tab = getslot(J, ra-1);
  ix.idxchain = 0;
#ifdef LUAJIT_ENABLE_TABLE_BUMP
  if ((J->flags & JIT_F_OPT_SINK)) {
    if (t->asize < i+rn-ra)
      lj_tab_reasize(J->L, t, i+rn-ra);
    setnilV(&ix.keyv);
    rec_idx_bump(J, &ix);
  }
#endif
  for (; ra < rn; i++, ra++) {
    setintV(&ix.keyv, i);
    ix.key = lj_ir_kint(J, i);
    copyTV(J->L, &ix.valv, &basev[ra]);
    ix.val = getslot(J, ra);
    lj_record_idx(J, &ix);
  }
}